

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O3

int __thiscall Fl_Tree::open(Fl_Tree *this,char *__file,int __oflag,...)

{
  int iVar1;
  
  iVar1 = 0;
  if (__file[0x18] == '\0') {
    Fl_Tree_Item::open((Fl_Tree_Item *)__file,__file,__oflag);
    Fl_Widget::redraw((Fl_Widget *)this);
    iVar1 = 1;
    if (__oflag != 0) {
      this->_callback_reason = FL_TREE_REASON_OPENED;
      this->_callback_item = (Fl_Tree_Item *)__file;
      Fl_Widget::do_callback
                ((Fl_Widget *)this,(Fl_Widget *)this,
                 (this->super_Fl_Group).super_Fl_Widget.user_data_);
    }
  }
  return iVar1;
}

Assistant:

int Fl_Tree::open(Fl_Tree_Item *item, int docallback) {
  if ( item->is_open() ) return(0);
  item->open();		// handles recalc_tree()
  redraw();
  if ( docallback ) {
    do_callback_for_item(item, FL_TREE_REASON_OPENED);
  }
  return(1);
}